

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool __thiscall
ON_SubDimple::LocalSubdivide(ON_SubDimple *this,ON_SubDFace **face_list,size_t face_list_count)

{
  ON_ComponentStatus *pOVar1;
  byte bVar2;
  char cVar3;
  ON_ComponentStatus OVar4;
  ON_SubDLevel *this_00;
  long lVar5;
  ON_SubDFace *pOVar6;
  ON_SubDEdgeSharpness OVar7;
  double sharpness1;
  ON_3dPoint vertex_location;
  int iVar8;
  bool bVar9;
  bool bVar10;
  ushort uVar11;
  uint uVar12;
  uint uVar13;
  double *pdVar14;
  ON_SubDEdge *this_01;
  ON_SubDVertex *pOVar15;
  ON_SubDFace *pOVar16;
  size_t i;
  size_t sVar17;
  ON_SubDEdgePtr *pOVar18;
  ulong uVar19;
  ON_SubDVertex *v1;
  long lVar20;
  uint fei;
  ulong uVar21;
  ulong uVar22;
  ON_SubDEdge *pOVar23;
  ulong uVar24;
  uint uVar25;
  double sharpness0;
  ON_3dPoint P;
  ON_SubDEdge *r;
  ON_SimpleArray<ON_SubDEdge_*> radial_edges;
  ON_SimpleArray<ON_SubDEdgePtr> fbdry;
  ON_SimpleArray<ON_3dPoint> edge_points;
  ON_SimpleArray<ON_3dPoint> face_points;
  ON_SimpleArray<ON_SubDEdge_*> edges;
  ON_SimpleArray<ON_SubDFace_*> faces;
  float local_138;
  float fStack_134;
  ON_3dPoint local_118;
  ON_3dPoint local_f8;
  ulong local_e0;
  ON_SubDFace *local_d0;
  ON_SimpleArray<ON_SubDEdge_*> local_c8;
  ON_SimpleArray<ON_SubDEdgePtr> local_b0;
  ON_SubDHeap *local_98;
  ON_SimpleArray<ON_3dPoint> local_90;
  ON_SimpleArray<ON_3dPoint> local_78;
  ON_SimpleArray<ON_SubDEdge_*> local_60;
  ON_SimpleArray<ON_SubDFace_*> local_48;
  
  if ((face_list_count != 0 && face_list != (ON_SubDFace **)0x0) &&
     (uVar12 = (this->m_levels).m_count, uVar12 != 0)) {
    sVar17 = 0;
    do {
      pOVar16 = face_list[sVar17];
      if ((pOVar16 != (ON_SubDFace *)0x0) && (2 < pOVar16->m_edge_count)) {
        bVar2 = (pOVar16->super_ON_SubDComponentBase).m_level;
        if (bVar2 < uVar12) {
          if (((this->m_levels).m_a[bVar2] != (ON_SubDLevel *)0x0) &&
             (ClearHigherSubdivisionLevels(this,bVar2 + 1), bVar2 + 1 == (this->m_levels).m_count))
          {
            this_00 = (this->m_levels).m_a[bVar2];
            this->m_active_level = this_00;
            if ((this_00 != (ON_SubDLevel *)0x0) && (this_00->m_face_count != 0)) {
              ON_SubDLevel::ClearRuntimeMarks(this_00,true,true,true);
              uVar13 = 0;
              uVar25 = 0;
              uVar12 = 0;
              sVar17 = 0;
              goto LAB_005daa44;
            }
          }
          break;
        }
      }
      sVar17 = sVar17 + 1;
    } while (face_list_count != sVar17);
LAB_005da9a3:
    ON_SubDIncrementErrorCount();
  }
  return false;
  while (sVar17 = sVar17 + 1, sVar17 != face_list_count) {
LAB_005daa44:
    pOVar16 = face_list[sVar17];
    if (((pOVar16 != (ON_SubDFace *)0x0) && (2 < pOVar16->m_edge_count)) &&
       (bVar2 == (pOVar16->super_ON_SubDComponentBase).m_level)) {
      pOVar1 = &(pOVar16->super_ON_SubDComponentBase).m_status;
      bVar9 = ON_ComponentStatus::RuntimeMark(pOVar1);
      if (!bVar9) {
        ON_ComponentStatus::SetRuntimeMark(pOVar1);
        pdVar14 = ON_3dPoint::operator_cast_to_double_(&local_118);
        bVar9 = ON_SubDFace::GetSubdivisionPoint(pOVar16,pdVar14);
        if (!bVar9) goto LAB_005da9a3;
        if (pOVar16->m_edge_count != 0) {
          pOVar18 = pOVar16->m_edge4;
          uVar11 = 0;
          local_d0 = pOVar16;
          do {
            if (((uVar11 == 4) && (pOVar18 = local_d0->m_edgex, pOVar18 == (ON_SubDEdgePtr *)0x0))
               || ((pOVar23 = (ON_SubDEdge *)(pOVar18->m_ptr & 0xfffffffffffffff8),
                   pOVar23 == (ON_SubDEdge *)0x0 ||
                   ((pOVar23->m_vertex[0] == (ON_SubDVertex *)0x0 ||
                    (pOVar23->m_vertex[1] == (ON_SubDVertex *)0x0)))))) goto LAB_005da9a3;
            pOVar1 = &(pOVar23->super_ON_SubDComponentBase).m_status;
            bVar9 = ON_ComponentStatus::RuntimeMark(pOVar1);
            if (!bVar9) {
              ON_SubDEdge::UpdateEdgeSectorCoefficientsForExperts(pOVar23,true);
              ON_ComponentStatus::SetRuntimeMark(pOVar1);
              pdVar14 = ON_3dPoint::operator_cast_to_double_(&local_118);
              bVar9 = ON_SubDEdge::GetSubdivisionPoint(pOVar23,pdVar14);
              if (!bVar9) goto LAB_005da9a3;
              lVar20 = 0;
              bVar9 = true;
              do {
                bVar10 = bVar9;
                bVar9 = ON_ComponentStatus::RuntimeMark
                                  (&(pOVar23->m_vertex[lVar20]->super_ON_SubDComponentBase).m_status
                                  );
                if (!bVar9) {
                  ON_ComponentStatus::SetRuntimeMark
                            (&(pOVar23->m_vertex[lVar20]->super_ON_SubDComponentBase).m_status);
                  pOVar15 = pOVar23->m_vertex[lVar20];
                  pdVar14 = ON_3dPoint::operator_cast_to_double_(&local_118);
                  bVar9 = ON_SubDVertex::GetSubdivisionPoint(pOVar15,pdVar14);
                  if (!bVar9) goto LAB_005da9a3;
                  uVar12 = uVar12 + 1;
                }
                lVar20 = 1;
                bVar9 = false;
              } while (bVar10);
              uVar25 = uVar25 + 1;
            }
            uVar11 = uVar11 + 1;
            pOVar18 = pOVar18 + 1;
          } while (uVar11 < local_d0->m_edge_count);
        }
        uVar13 = uVar13 + 1;
      }
    }
  }
  bVar9 = false;
  if (((uVar13 != 0) && (2 < uVar25)) && (2 < uVar12)) {
    if (uVar13 < this_00->m_face_count) {
      uVar24 = (ulong)uVar13;
      local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00819ce0;
      local_48.m_a = (ON_SubDFace **)0x0;
      local_48.m_count = 0;
      local_48.m_capacity = 0;
      ON_SimpleArray<ON_SubDFace_*>::SetCapacity(&local_48,uVar24);
      local_78._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808fd0;
      local_78.m_a = (ON_3dPoint *)0x0;
      local_78.m_count = 0;
      local_78.m_capacity = 0;
      local_d0 = (ON_SubDFace *)uVar24;
      ON_SimpleArray<ON_3dPoint>::SetCapacity(&local_78,uVar24);
      ChangeGeometryContentSerialNumber(this,false);
      pOVar16 = this_00->m_face[0];
      if (pOVar16 != (ON_SubDFace *)0x0) {
        do {
          bVar9 = ON_ComponentStatus::RuntimeMark(&(pOVar16->super_ON_SubDComponentBase).m_status);
          if (bVar9) {
            local_f8.x = (double)pOVar16;
            ON_SimpleArray<ON_SubDFace_*>::Append(&local_48,(ON_SubDFace **)&local_f8);
            ON_SubDFace::SubdivisionPoint(&local_f8,pOVar16);
            local_118.z = local_f8.z;
            local_118.x = local_f8.x;
            local_118.y = local_f8.y;
            bVar9 = ON_3dPoint::IsValid(&local_118);
            if (!bVar9) {
              ON_SubDIncrementErrorCount();
              goto LAB_005db483;
            }
            ON_SimpleArray<ON_3dPoint>::Append(&local_78,&local_118);
          }
          pOVar16 = pOVar16->m_next_face;
        } while (pOVar16 != (ON_SubDFace *)0x0);
      }
      if (uVar13 == local_78.m_count) {
        uVar24 = (ulong)uVar25;
        local_90._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808fd0;
        local_90.m_a = (ON_3dPoint *)0x0;
        local_90.m_count = 0;
        local_90.m_capacity = 0;
        ON_SimpleArray<ON_3dPoint>::SetCapacity(&local_90,uVar24);
        local_60._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00819d20;
        local_60.m_a = (ON_SubDEdge **)0x0;
        local_60.m_count = 0;
        local_60.m_capacity = 0;
        ON_SimpleArray<ON_SubDEdge_*>::SetCapacity(&local_60,uVar24);
        pOVar16 = (ON_SubDFace *)this_00->m_edge[0];
        if (pOVar16 != (ON_SubDFace *)0x0) {
          do {
            bVar9 = ON_ComponentStatus::RuntimeMark(&(pOVar16->super_ON_SubDComponentBase).m_status)
            ;
            if (bVar9) {
              cVar3 = (char)pOVar16->m_reserved1;
              if (((cVar3 == '\x04') || (cVar3 == '\x01')) &&
                 (((short)pOVar16->m_pack_id == 2 &&
                  (uVar12 = ON_SubDEdge::MarkedFaceCount((ON_SubDEdge *)pOVar16), uVar12 == 2)))) {
                ON_SubDEdge::SubdivisionPoint(&local_f8,(ON_SubDEdge *)pOVar16);
              }
              else {
                ON_SubDEdge::ControlNetCenterPoint(&local_f8,(ON_SubDEdge *)pOVar16);
              }
              local_118.z = local_f8.z;
              local_118.x = local_f8.x;
              local_118.y = local_f8.y;
              ON_SimpleArray<ON_3dPoint>::Append(&local_90,&local_118);
              local_f8.x = (double)pOVar16;
              ON_SimpleArray<ON_SubDEdge_*>::Append(&local_60,(ON_SubDEdge **)&local_f8);
            }
            pOVar16 = pOVar16->m_next_face;
          } while (pOVar16 != (ON_SubDFace *)0x0);
        }
        if (uVar25 == local_90.m_count) {
          pOVar15 = this_00->m_vertex[0];
          if (pOVar15 != (ON_SubDVertex *)0x0) {
            do {
              bVar9 = ON_ComponentStatus::RuntimeMark
                                (&(pOVar15->super_ON_SubDComponentBase).m_status);
              if (((bVar9) && (uVar11 = pOVar15->m_edge_count, 1 < uVar11)) &&
                 (uVar12 = ON_SubDVertex::MarkedEdgeCount(pOVar15), uVar12 == uVar11)) {
                ON_SubDVertex::SubdivisionPoint(&local_f8,pOVar15);
                local_118.z = local_f8.z;
                local_118.x = local_f8.x;
                local_118.y = local_f8.y;
                pOVar15->m_P[0] = local_f8.x;
                pOVar15->m_P[1] = local_f8.y;
                pOVar15->m_P[2] = local_f8.z;
              }
              pOVar15 = pOVar15->m_next_vertex;
            } while (pOVar15 != (ON_SubDVertex *)0x0);
          }
          lVar20 = 0;
          uVar21 = 0;
          do {
            pOVar23 = local_60.m_a[uVar21];
            OVar7 = ON_SubDEdge::Sharpness(pOVar23,false);
            ON_SubDEdge::EdgeModifiedNofification(pOVar23);
            vertex_location.z = *(double *)((long)&(local_90.m_a)->z + lVar20);
            vertex_location._0_16_ = *(undefined1 (*) [16])((long)&(local_90.m_a)->x + lVar20);
            this_01 = SplitEdge(this,pOVar23,vertex_location);
            if (this_01 == (ON_SubDEdge *)0x0) {
              ON_SubDIncrementErrorCount();
              goto LAB_005db494;
            }
            ON_ComponentStatus::ClearRuntimeMark(&(this_01->super_ON_SubDComponentBase).m_status);
            ON_ComponentStatus::SetRuntimeMark(&(pOVar23->super_ON_SubDComponentBase).m_status);
            local_138 = OVar7.m_edge_sharpness[0];
            fStack_134 = OVar7.m_edge_sharpness[1];
            sharpness0 = (double)local_138;
            if ((local_138 != fStack_134) || (NAN(local_138) || NAN(fStack_134))) {
              sharpness1 = ON_SubDEdgeSharpness::Sanitize
                                     ((sharpness0 + (double)fStack_134) * 0.5,0.0);
              OVar7 = ON_SubDEdgeSharpness::FromInterval(sharpness0,sharpness1);
              ON_SubDEdge::SetSharpnessForExperts(pOVar23,OVar7);
            }
            else {
              OVar7 = ON_SubDEdgeSharpness::FromInterval(sharpness0,sharpness0);
              ON_SubDEdge::SetSharpnessForExperts(pOVar23,OVar7);
              sharpness1 = sharpness0;
            }
            OVar7 = ON_SubDEdgeSharpness::FromInterval(sharpness1,(double)fStack_134);
            ON_SubDEdge::SetSharpnessForExperts(this_01,OVar7);
            uVar21 = uVar21 + 1;
            lVar20 = lVar20 + 0x18;
          } while (uVar24 != uVar21);
          local_b0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00816d78;
          local_b0.m_a = (ON_SubDEdgePtr *)0x0;
          local_b0.m_count = 0;
          local_b0.m_capacity = 0;
          ON_SimpleArray<ON_SubDEdgePtr>::SetCapacity(&local_b0,0x20);
          local_c8._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00819d20;
          local_c8.m_a = (ON_SubDEdge **)0x0;
          local_c8.m_count = 0;
          local_c8.m_capacity = 0;
          ON_SimpleArray<ON_SubDEdge_*>::SetCapacity(&local_c8,0x20);
          local_98 = &this->m_heap;
          uVar24 = 0;
          bVar9 = false;
          do {
            pOVar16 = local_48.m_a[uVar24];
            ON_SubDFace::FaceModifiedNofification(pOVar16);
            local_118.x = local_78.m_a[uVar24].x;
            local_118.y = local_78.m_a[uVar24].y;
            local_118.z = local_78.m_a[uVar24].z;
            if (-1 < (long)local_b0._16_8_) {
              local_b0._16_8_ = local_b0._16_8_ & 0xffffffff00000000;
            }
            uVar12 = ON_SubDFace::GetEdgeArray(pOVar16,&local_b0);
            pOVar18 = local_b0.m_a;
            if ((uVar12 < 6) || ((uVar12 & 1) != 0)) {
              ON_SubDIncrementErrorCount();
              goto LAB_005db4a5;
            }
            uVar21 = (local_b0.m_a)->m_ptr & 0xfffffffffffffff8;
            if (((uVar21 != 0) &&
                (lVar20 = *(long *)(uVar21 + 0x80 + (ulong)((uint)(local_b0.m_a)->m_ptr & 1) * 8),
                lVar20 != 0)) &&
               (bVar10 = ON_ComponentStatus::RuntimeMark((ON_ComponentStatus *)(lVar20 + 0x10)),
               !bVar10)) {
              ON_SimpleArray<ON_SubDEdgePtr>::Append(&local_b0,pOVar18);
              pOVar18 = local_b0.m_a + 1;
            }
            uVar25 = (pOVar16->super_ON_SubDComponentBase).m_id;
            OVar4 = (pOVar16->super_ON_SubDComponentBase).m_status;
            uVar21 = (ulong)uVar12;
            uVar22 = 0;
            do {
              uVar19 = pOVar18[uVar22].m_ptr & 0xfffffffffffffff8;
              if (uVar19 == 0) {
                ON_SubDIncrementErrorCount();
                goto LAB_005db4a5;
              }
              uVar13 = (uint)pOVar18[uVar22].m_ptr & 1;
              lVar20 = *(long *)(uVar19 + 0x80 + (ulong)uVar13 * 8);
              lVar5 = *(long *)(uVar19 + 0x80 + (ulong)(uVar13 ^ 1) * 8);
              if (((lVar20 == lVar5) || (lVar20 == 0)) || (lVar5 == 0)) {
LAB_005db499:
                ON_SubDIncrementErrorCount();
                goto LAB_005db4a5;
              }
              if ((uVar22 & 1) == 0) {
                bVar10 = ON_ComponentStatus::RuntimeMark((ON_ComponentStatus *)(lVar20 + 0x10));
                if ((!bVar10) ||
                   (bVar10 = ON_ComponentStatus::RuntimeMark((ON_ComponentStatus *)(lVar5 + 0x10)),
                   bVar10)) goto LAB_005db499;
              }
              else {
                bVar10 = ON_ComponentStatus::RuntimeMark((ON_ComponentStatus *)(lVar20 + 0x10));
                if ((bVar10) ||
                   (bVar10 = ON_ComponentStatus::RuntimeMark((ON_ComponentStatus *)(lVar5 + 0x10)),
                   !bVar10)) goto LAB_005db499;
              }
              uVar22 = uVar22 + 1;
            } while (uVar21 != uVar22);
            if (pOVar16->m_edge_count != 0) {
              uVar22 = 0;
              do {
                ON_SubDEdge::RemoveFaceFromArray
                          ((ON_SubDEdge *)(pOVar18[uVar22].m_ptr & 0xfffffffffffffff8),pOVar16);
                ON_SubDVertex::RemoveFaceFromArray
                          (*(ON_SubDVertex **)
                            ((pOVar18[uVar22].m_ptr & 0xfffffffffffffff8) + 0x80 +
                            (ulong)((uint)pOVar18[uVar22].m_ptr & 1) * 8),pOVar16);
                uVar22 = uVar22 + 1;
              } while (uVar22 < pOVar16->m_edge_count);
            }
            ReturnFace(this,pOVar16);
            pOVar15 = ON_SubDHeap::AllocateVertexAndSetId(local_98,0);
            (pOVar15->super_ON_SubDComponentBase).m_level = bVar2;
            pOVar15->m_vertex_tag = Smooth;
            pOVar15->m_P[0] = local_118.x;
            pOVar15->m_P[1] = local_118.y;
            pOVar15->m_P[2] = local_118.z;
            AddVertexToLevel(this,pOVar15);
            iVar8 = local_c8.m_capacity;
            if (-1 < (long)local_c8._16_8_) {
              local_c8._16_8_ = (ulong)(uint)local_c8.m_capacity << 0x20;
            }
            uVar13 = uVar12 >> 1;
            if ((uint)iVar8 < uVar13) {
              ON_SimpleArray<ON_SubDEdge_*>::SetCapacity(&local_c8,(ulong)uVar13);
            }
            uVar22 = 0;
            do {
              uVar19 = pOVar18[uVar22].m_ptr & 0xfffffffffffffff8;
              if (uVar19 == 0) {
                v1 = (ON_SubDVertex *)0x0;
              }
              else {
                v1 = *(ON_SubDVertex **)
                      (uVar19 + 0x80 + (ulong)(~(uint)pOVar18[uVar22].m_ptr & 1) * 8);
              }
              local_f8.x = (double)AddEdge(this,0,Smooth,pOVar15,-8883.0,v1,-8883.0,0);
              ON_SimpleArray<ON_SubDEdge_*>::Append(&local_c8,(ON_SubDEdge **)&local_f8);
              uVar22 = uVar22 + 2;
            } while (uVar22 < uVar21);
            uVar22 = 0;
            pOVar16 = (ON_SubDFace *)local_c8.m_a[uVar13 - 1];
            do {
              pOVar6 = *(ON_SubDFace **)((long)local_c8.m_a + uVar22 * 4);
              local_f8.y = (double)pOVar18[(ulong)((uVar12 - 1) + (int)uVar22) % (ulong)uVar12].
                                   m_ptr;
              local_f8.z = (double)pOVar18[uVar22].m_ptr;
              local_e0 = (ulong)pOVar6 | 1;
              local_f8.x = (double)pOVar16;
              pOVar16 = AddFace(this,uVar25,4,(ON_SubDEdgePtr *)&local_f8);
              (pOVar16->super_ON_SubDComponentBase).m_status = OVar4;
              uVar22 = uVar22 + 2;
              uVar25 = 0;
              pOVar16 = pOVar6;
            } while (uVar22 < uVar21);
            uVar24 = uVar24 + 1;
            bVar9 = local_d0 <= uVar24;
          } while ((ON_SubDFace *)uVar24 != local_d0);
          ON_SubDLevel::ClearRuntimeMarks(this_00,true,true,false);
          (this_00->m_aggregates).m_bDirtyBoundingBox = true;
          ON_SubDLevel::ClearEvaluationCache(this_00);
          (this_00->m_aggregates).m_bDirtyEdgeAttributes = true;
          bVar9 = true;
          if (this->m_active_level != (ON_SubDLevel *)0x0) {
            ON_SubDLevel::UpdateAllTagsAndSectorCoefficients(this->m_active_level,true);
          }
LAB_005db4a5:
          ON_SimpleArray<ON_SubDEdge_*>::~ON_SimpleArray(&local_c8);
          ON_SimpleArray<ON_SubDEdgePtr>::~ON_SimpleArray(&local_b0);
        }
        else {
          ON_SubDIncrementErrorCount();
LAB_005db494:
          bVar9 = false;
        }
        ON_SimpleArray<ON_SubDEdge_*>::~ON_SimpleArray(&local_60);
        ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_90);
      }
      else {
        ON_SubDIncrementErrorCount();
LAB_005db483:
        bVar9 = false;
      }
      ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_78);
      ON_SimpleArray<ON_SubDFace_*>::~ON_SimpleArray(&local_48);
    }
    else {
      uVar12 = GlobalSubdivide(this);
      bVar9 = uVar12 != 0;
    }
  }
  return bVar9;
}

Assistant:

bool ON_SubDimple::LocalSubdivide(
  ON_SubDFace const*const* face_list,
  size_t face_list_count
)
{
  if (nullptr == face_list || face_list_count < 1 || m_levels.UnsignedCount() < 1)
    return false;

  unsigned int level0_index = ON_UNSET_UINT_INDEX;
  for (size_t i = 0; i < face_list_count; ++i)
  {
    const ON_SubDFace* f = face_list[i];
    if (nullptr == f || f->m_edge_count < 3 || f->SubdivisionLevel() >= m_levels.UnsignedCount())
      continue;
    level0_index = f->SubdivisionLevel();
    break;
  }
  
  if (level0_index >= m_levels.UnsignedCount() || nullptr == m_levels[level0_index])
    return ON_SUBD_RETURN_ERROR(false);

  ClearHigherSubdivisionLevels(level0_index + 1);
  if (level0_index + 1 != m_levels.UnsignedCount())
    return ON_SUBD_RETURN_ERROR(false);

  m_active_level = m_levels[level0_index];
  if ( nullptr == m_active_level || 0 == m_active_level->m_face_count)
    return ON_SUBD_RETURN_ERROR(false);

  ON_SubDLevel& level0 = *m_levels[level0_index];
  m_active_level = &level0;

  level0.ClearRuntimeMarks(true, true, true);

  unsigned face_count = 0;
  unsigned edge_count = 0;
  unsigned vertex_count = 0;
  ON_3dPoint P;
  for (size_t i = 0; i < face_list_count; ++i)
  {
    const ON_SubDFace* f = face_list[i];
    if (nullptr == f || f->m_edge_count < 3 || level0_index != f->SubdivisionLevel() )
      continue;
    if (f->m_status.RuntimeMark())
      continue;
    f->m_status.SetRuntimeMark();
    if ( false == f->GetSubdivisionPoint(P))
      return ON_SUBD_RETURN_ERROR(false);
    const ON_SubDEdgePtr* eptr = f->m_edge4;
    for (unsigned short fei = 0; fei < f->m_edge_count; ++fei, ++eptr)
    {
      if (4 == fei)
      {
        eptr = f->m_edgex;
        if (nullptr == eptr)
          return ON_SUBD_RETURN_ERROR(false);
      }
      ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
      if (nullptr == e || nullptr == e->m_vertex[0] || nullptr == e->m_vertex[1])
        return ON_SUBD_RETURN_ERROR(false);
      if (e->m_status.RuntimeMark())
        continue;
      e->UpdateEdgeSectorCoefficientsForExperts(true);
      e->m_status.SetRuntimeMark();
      if (false == e->GetSubdivisionPoint(P))
        return ON_SUBD_RETURN_ERROR(false);
      for (unsigned evi = 0; evi < 2; ++evi)
      {
        if (e->m_vertex[evi]->m_status.RuntimeMark())
          continue;
        e->m_vertex[evi]->m_status.SetRuntimeMark();
        if ( false == e->m_vertex[evi]->GetSubdivisionPoint(P) )
          return ON_SUBD_RETURN_ERROR(false);
        ++vertex_count;
      }
      ++edge_count;
    }
    ++face_count;
  }
  if (face_count < 1 || edge_count < 3 || vertex_count < 3)
    return false;
  if (face_count >= level0.m_face_count)
    return GlobalSubdivide();

  // Get face subdivision points
  ON_SimpleArray<ON_SubDFace*> faces(face_count);
  ON_SimpleArray<ON_3dPoint> face_points(face_count);

  // this subd is being modified.
  ChangeGeometryContentSerialNumber( false);

  for (const ON_SubDFace* f0 = level0.m_face[0]; nullptr != f0; f0 = f0->m_next_face)
  {
    if (false == f0->m_status.RuntimeMark())
      continue;
    faces.Append(const_cast<ON_SubDFace*>(f0));
    P = f0->SubdivisionPoint();
    if ( false == P.IsValid())
      return ON_SUBD_RETURN_ERROR(false);
    face_points.Append(P);
  }
  if (face_count != face_points.UnsignedCount())
    return ON_SUBD_RETURN_ERROR(false);

  // Get edge subdivision points
  ON_SimpleArray<ON_3dPoint> edge_points(edge_count);
  ON_SimpleArray<ON_SubDEdge*> edges(edge_count);
  for (const ON_SubDEdge* e0 = level0.m_edge[0]; nullptr != e0; e0 = e0->m_next_edge)
  {
    if (false == e0->m_status.RuntimeMark())
      continue;
    P = (e0->IsSmooth() && 2 == e0->m_face_count && 2 == e0->MarkedFaceCount()) ? e0->SubdivisionPoint() : e0->ControlNetCenterPoint();
    edge_points.Append(P);
    edges.Append(const_cast<ON_SubDEdge*>(e0));
  }
  if ( edge_count != edge_points.UnsignedCount())
    return ON_SUBD_RETURN_ERROR(false);

  // Set vertex points
  for (const ON_SubDVertex* v0 = level0.m_vertex[0]; nullptr != v0; v0 = v0->m_next_vertex)
  {
    if (false == v0->m_status.RuntimeMark() || v0->m_edge_count < 2 || ((unsigned)v0->m_edge_count) != v0->MarkedEdgeCount())
      continue;
    P = v0->SubdivisionPoint();
    ON_SubDVertex* v = const_cast<ON_SubDVertex*>(v0);
    v->m_P[0] = P.x;
    v->m_P[1] = P.y;
    v->m_P[2] = P.z;
  }

  // split edges
  for (unsigned edex = 0; edex < edge_count; ++edex)
  {
    ON_SubDEdge* e = edges[edex];

    const ON_SubDEdgeSharpness e_sharpness = e->Sharpness(false);

    e->EdgeModifiedNofification();
    const ON_SubDEdge* new_edge = SplitEdge(e, edge_points[edex]);
    if (nullptr == new_edge)
      return ON_SUBD_RETURN_ERROR(false);
    new_edge->m_status.ClearRuntimeMark();
    e->m_status.SetRuntimeMark();

    // LOCAL subdivide is more of an add control points to an existing level
    // as opposed to a global subdivision level operation. It will be common
    // for the input to include some but not all sharp edges.
    // Dale Lear's best guess on Nov 9, 2022 is that
    // reusing the original sharpness is the best way to maximize overall
    // user happiness. This makes some sense because the level of the edges
    // is not changing in a LOCAL subdivide. 
    // It is a near certainty that some users will not like this in some cases. 
    const_cast<ON_SubDEdge*>(e)->SetSharpnessForExperts(ON_SubDEdgeSharpness::FromInterval(e_sharpness[0], e_sharpness.Average()));
    const_cast<ON_SubDEdge*>(new_edge)->SetSharpnessForExperts(ON_SubDEdgeSharpness::FromInterval(e_sharpness.Average(), e_sharpness[1]));
  }

  ON_SimpleArray<ON_SubDEdgePtr> fbdry(32);
  ON_SimpleArray<ON_SubDEdge*> radial_edges(32);
  for (unsigned fdex = 0; fdex < face_count; ++fdex)
  {
    ON_SubDFace* f = faces[fdex];
    f->FaceModifiedNofification();
    P = face_points[fdex];
    fbdry.SetCount(0);
    const unsigned e_count = f->GetEdgeArray(fbdry);
    if (e_count < 6 || 0 != e_count %2)
      return ON_SUBD_RETURN_ERROR(false);

    // Get edges[] with edge[0] = marked edges.
    const ON_SubDEdgePtr* eptrs = fbdry.Array();
    if (nullptr != eptrs[0].RelativeVertex(0) && false == eptrs[0].RelativeVertex(0)->Mark() )
    {
      fbdry.Append(eptrs[0]);
      eptrs = fbdry.Array() + 1;
    }

    // save face status and candidate_face
    unsigned int candidate_face_id = f->m_id;
    const ON_ComponentStatus fstatus = f->m_status;

    for (unsigned fei = 0; fei < e_count; ++fei)
    {
      ON_SubDEdge* e = eptrs[fei].Edge();
      if ( nullptr == e)
        return ON_SUBD_RETURN_ERROR(false);
      const ON_SubDVertex* ev[2] = { eptrs[fei].RelativeVertex(0), eptrs[fei].RelativeVertex(1) };
      if ( nullptr == ev[0] || nullptr == ev[1] || ev[0] == ev[1])
        return ON_SUBD_RETURN_ERROR(false);
      if (0 == fei % 2)
      {
        if (false == ev[0]->Mark())
          return ON_SUBD_RETURN_ERROR(false);
        if (ev[1]->Mark())
          return ON_SUBD_RETURN_ERROR(false);
      }
      else
      {
        if (ev[0]->Mark())
          return ON_SUBD_RETURN_ERROR(false);
        if (false == ev[1]->Mark())
          return ON_SUBD_RETURN_ERROR(false);
      }
    }

    // remove face that will be subdivided;
    for (unsigned short fei = 0; fei < f->m_edge_count; ++fei)
    {
      eptrs[fei].Edge()->RemoveFaceFromArray(f);
      const_cast<ON_SubDVertex*>(eptrs[fei].RelativeVertex(0))->RemoveFaceFromArray(f);
    }
    ReturnFace(f);
    
    ON_SubDVertex* center = AllocateVertex(ON_SubDVertexTag::Smooth, level0_index, &P.x);
    AddVertexToLevel(center);

    radial_edges.SetCount(0);
    radial_edges.Reserve(e_count /2);
    for (unsigned fei = 0; fei < e_count; fei += 2)
    {
      ON_SubDEdge* r = AddEdge(ON_SubDEdgeTag::Smooth, center, ON_SubDSectorType::UnsetSectorCoefficient, const_cast<ON_SubDVertex*>(eptrs[fei].RelativeVertex(1)), ON_SubDSectorType::UnsetSectorCoefficient);
      radial_edges.Append(r);
    }

    ON_SubDEdge* r[2] = { nullptr,radial_edges[e_count / 2 - 1] };
    for (unsigned fei = 0; fei < e_count; fei += 2)
    {
      r[0] = r[1];
      r[1] = radial_edges[fei / 2];
      const ON_SubDEdgePtr qbdry[4] = {
        ON_SubDEdgePtr::Create(r[0],0),
        eptrs[(fei + e_count - 1) % e_count],
        eptrs[fei],
        ON_SubDEdgePtr::Create(r[1],1) 
      };
      ON_SubDFace* q = AddFace(candidate_face_id, 4, qbdry);
      candidate_face_id = 0;
      q->m_status = fstatus;
    }

  }

  level0.ClearRuntimeMarks(true, true, false);
  level0.ClearBoundingBox();
  level0.ClearEvaluationCache();
  level0.ClearEdgeFlags();

  if (nullptr != m_active_level)
    m_active_level->UpdateAllTagsAndSectorCoefficients(true);
  
  return true; 
}